

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O1

ze_result_t
loader::zesDeviceEnumTemperatureSensors
          (zes_device_handle_t hDevice,uint32_t *pCount,zes_temp_handle_t *phTemperature)

{
  zes_pfnDeviceEnumTemperatureSensors_t p_Var1;
  ze_result_t zVar2;
  object_t<_zes_temp_handle_t_*> *poVar3;
  ulong uVar4;
  long lVar5;
  dditable_t *dditable;
  dditable_t *local_38;
  
  local_38 = *(dditable_t **)(hDevice + 8);
  p_Var1 = (local_38->zes).Device.pfnEnumTemperatureSensors;
  if (p_Var1 == (zes_pfnDeviceEnumTemperatureSensors_t)0x0) {
    zVar2 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    zVar2 = (*p_Var1)(*(zes_device_handle_t *)hDevice,pCount,phTemperature);
    if (zVar2 == ZE_RESULT_SUCCESS) {
      zVar2 = ZE_RESULT_SUCCESS;
      if (phTemperature != (zes_temp_handle_t *)0x0) {
        lVar5 = 0;
        uVar4 = 0;
        do {
          if (*pCount <= uVar4) {
            return ZE_RESULT_SUCCESS;
          }
          poVar3 = singleton_factory_t<object_t<_zes_temp_handle_t*>,_zes_temp_handle_t*>::
                   getInstance<_zes_temp_handle_t*&,dditable_t*&>
                             ((singleton_factory_t<object_t<_zes_temp_handle_t*>,_zes_temp_handle_t*>
                               *)(context + 0xe40),
                              (_zes_temp_handle_t **)((long)phTemperature + lVar5),&local_38);
          phTemperature[uVar4] = (zes_temp_handle_t)poVar3;
          uVar4 = uVar4 + 1;
          lVar5 = lVar5 + 8;
          zVar2 = ZE_RESULT_SUCCESS;
        } while (phTemperature != (zes_temp_handle_t *)0x0);
      }
    }
  }
  return zVar2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceEnumTemperatureSensors(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        uint32_t* pCount,                               ///< [in,out] pointer to the number of components of this type.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of components of this type that are available.
                                                        ///< if count is greater than the number of components of this type that
                                                        ///< are available, then the driver shall update the value with the correct
                                                        ///< number of components.
        zes_temp_handle_t* phTemperature                ///< [in,out][optional][range(0, *pCount)] array of handle of components of
                                                        ///< this type.
                                                        ///< if count is less than the number of components of this type that are
                                                        ///< available, then the driver shall only retrieve that number of
                                                        ///< component handles.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_device_object_t*>( hDevice )->dditable;
        auto pfnEnumTemperatureSensors = dditable->zes.Device.pfnEnumTemperatureSensors;
        if( nullptr == pfnEnumTemperatureSensors )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<zes_device_object_t*>( hDevice )->handle;

        // forward to device-driver
        result = pfnEnumTemperatureSensors( hDevice, pCount, phTemperature );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handles to loader handles
            for( size_t i = 0; ( nullptr != phTemperature ) && ( i < *pCount ); ++i )
                phTemperature[ i ] = reinterpret_cast<zes_temp_handle_t>(
                    context->zes_temp_factory.getInstance( phTemperature[ i ], dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }